

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  ev_impl *peVar4;
  long lVar5;
  char *filename;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  trans2p t;
  tun_param in_stack_ffffffffff8ab068;
  _Bool in_stack_ffffffffff8acacc;
  uint in_stack_ffffffffff8acbd0;
  uint in_stack_ffffffffff8accd4;
  _Bool in_stack_ffffffffff8accd8;
  _func_ev_impl_ptr *in_stack_ffffffffff8acce8;
  _func__Bool_ev_impl_ptr_ev_event_ptr *in_stack_ffffffffff8accf8;
  _func_void_ev_impl_ptr_int *in_stack_ffffffffff8acd00;
  _func_int_ev_impl_ptr_tun_param *in_stack_ffffffffff8acd10;
  int in_stack_ffffffffffcbde70;
  char acStack_10030 [65536];
  
  bVar8 = 0;
  if (argc < 2) {
    filename = "default.ini";
  }
  else {
    filename = argv[1];
  }
  memset(&stack0xffffffffff8ac1b0,0,0x800);
  memset(&stack0xffffffffff8ab998,0,0x810);
  memset(&stack0xffffffffff8ab180,0,0x810);
  config_init_default((trans2p_config *)&stack0xffffffffff8ac9c0);
  uVar2 = ini_parse(filename,iter_config,(trans2p_config *)&stack0xffffffffff8ac9c0);
  if (uVar2 == 0xfffffffe) {
    puts("alloc error");
    iVar3 = -2;
  }
  else {
    if (uVar2 == 0) {
      iVar3 = udp_socket();
      if (iVar3 == -1) {
        __assert_fail("t.dns.ev.fd != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                      ,0x1a2,"int main(int, char **)");
      }
      printf("binding dns server to %s:%d\n",&stack0xffffffffff8acad0,
             (ulong)in_stack_ffffffffff8acbd0);
      _Var1 = udp_bind(iVar3,&stack0xffffffffff8acad0,in_stack_ffffffffff8acbd0);
      if (_Var1) {
        dns_state_init((dns_state *)&stack0xffffffffffcce618);
        addr_mapper_init((addr_mapper *)&stack0xffffffffffcce618,(in_addr *)&stack0xffffffffff8acac4
                         ,(in_addr *)&stack0xffffffffff8acac8);
        i2p_crypto_init();
        i2cp_state_init((i2cp_state *)&stack0xffffffffff8acd48,i2cp_write,&stack0xffffffffff8ac9c0);
        i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd48,'!',onsetdate,
                            &stack0xffffffffff8ac9c0);
        i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd48,'\x14',onsessionstatus,
                            &stack0xffffffffff8ac9c0);
        i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd48,'%',onreqvarls,
                            &stack0xffffffffff8ac9c0);
        i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd48,'\x1f',onpayload,
                            &stack0xffffffffff8ac9c0);
        _Var1 = ev_init((ev_api *)&stack0xffffffffff8acce8);
        if (!_Var1) {
          __assert_fail("ev_init(&t.api)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                        ,0x1b6,"int main(int, char **)");
        }
        peVar4 = (*in_stack_ffffffffff8acce8)();
        if (peVar4 != (ev_impl *)0x0) {
          (*in_stack_ffffffffff8accf8)(peVar4,(ev_event *)&stack0xffffffffffcefe28);
          if (in_stack_ffffffffff8acacc == true) {
            printf("open tun interface %s\n",&stack0xffffffffff8ac9c0);
            puVar6 = (undefined8 *)&stack0xffffffffff8ac9c0;
            puVar7 = (undefined8 *)&stack0xffffffffff8ab068;
            for (lVar5 = 0x22; lVar5 != 0; lVar5 = lVar5 + -1) {
              *puVar7 = *puVar6;
              puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
              puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
            }
            iVar3 = (*in_stack_ffffffffff8acd10)(peVar4,in_stack_ffffffffff8ab068);
            if (iVar3 == -1) {
              printf("failed to open %s\n",&stack0xffffffffff8ac9c0);
              return 1;
            }
            (*in_stack_ffffffffff8accf8)(peVar4,(ev_event *)&stack0xffffffffffceff50);
          }
          else {
            puts("tun interface disabled");
          }
          while( true ) {
            while( true ) {
              while( true ) {
                puts("generate new identity");
                i2p_keygen((i2p_privkeybuf *)&stack0xffffffffffcbde76);
                i2p_privkey_dest((i2p_privkeybuf *)&stack0xffffffffffcbde76,
                                 (i2p_dest *)&stack0xffffffffffcbe150);
                i2p_dest_tob32addr((i2p_dest *)&stack0xffffffffffcbe150,acStack_10030,0x10000);
                printf("we are %s\n",acStack_10030);
                if (in_stack_ffffffffff8accd8 == true) break;
                mainloop((trans2p *)&stack0xffffffffff8ac9c0);
              }
              printf("connecting to i2p router at %s port %d\n",&stack0xffffffffff8acbd4,
                     (ulong)in_stack_ffffffffff8accd4);
              _Var1 = blocking_tcp_connect
                                (&stack0xffffffffff8acbd4,in_stack_ffffffffff8accd4,
                                 (int *)&stack0xffffffffffcbde70);
              if (_Var1) break;
              main_cold_1();
            }
            _Var1 = (*in_stack_ffffffffff8accf8)(peVar4,(ev_event *)&stack0xffffffffff8acd18);
            if (!_Var1) break;
            i2cp_begin((i2cp_state *)&stack0xffffffffff8acd48);
            mainloop((trans2p *)&stack0xffffffffff8ac9c0);
            (*in_stack_ffffffffff8acd00)(peVar4,in_stack_ffffffffffcbde70);
          }
          __assert_fail("api->add(t.impl, &t.i2cp_ev)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                        ,0x1dd,"int main(int, char **)");
        }
        __assert_fail("t.impl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                      ,0x1ba,"int main(int, char **)");
      }
      printf("failed to bind udp socket for dns at %s %d\n",&stack0xffffffffff8acad0,
             (ulong)in_stack_ffffffffff8acbd0);
    }
    else {
      if (uVar2 != 0xffffffff) {
        printf("error %d\n",(ulong)uVar2);
        return uVar2;
      }
      printf("cannot open %s\n",filename);
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char * argv[])
{
  const char * fname = "default.ini";


  if(argc > 1)
    fname = argv[1];
  
  struct trans2p t;

  struct handler tun_handler = {
    .t = &t,
    .read = &tun_onpacket,
    .write = &tun_flushwrite
  };
  
  struct handler i2cp_handler = {
    .t = &t,
    .read = &i2cp_onread,
    .write = NULL
  };

  struct handler dns_handler = {
    .t = &t,
    .read = &dns_onread,
    .write = NULL
  };
  
  config_init_default(&t.config);

  int err = ini_parse(fname, &iter_config, &t.config);
  if (err != 0)
  {
    if(err == -1)
      printf("cannot open %s\n", fname);
    else if(err == -2)
      printf("alloc error\n");
    else
      printf("error %d\n", err);
    return err;
  }

  t.dns.ev.flags = EV_READ;
  t.dns.ev.ptr = &dns_handler;
  t.dns.ev.fd = udp_socket();
  assert(t.dns.ev.fd != -1);
  printf("binding dns server to %s:%d\n", t.config.dns.addr, t.config.dns.port);
  if(!udp_bind(t.dns.ev.fd, t.config.dns.addr, t.config.dns.port))
  {
    printf("failed to bind udp socket for dns at %s %d\n", t.config.dns.addr, t.config.dns.port);
    return -1;
  }
  dns_state_init(&t.dns);

  addr_mapper_init(&t.dns.addr, &t.config.tun.addr, &t.config.tun.netmask);
  
  i2p_crypto_init();
  i2cp_state_init(&t.i2cp, &i2cp_write, &t);

  i2cp_set_msghandler(&t.i2cp, SETDATE, &onsetdate, &t);
  i2cp_set_msghandler(&t.i2cp, SESSIONSTATUS, &onsessionstatus, &t);
  i2cp_set_msghandler(&t.i2cp, REQVARLS, &onreqvarls, &t);
  i2cp_set_msghandler(&t.i2cp, PAYLOAD, &onpayload, &t);
  
  struct ev_api * api;
  assert(ev_init(&t.api));
  t.running = true;
  api = &t.api;
  t.impl = api->open();
  assert(t.impl);

  api->add(t.impl, &t.dns.ev);
  
  if(t.config.tun.enabled)
  {
    printf("open tun interface %s\n", t.config.tun.ifname);
    int tunfd = api->tun(t.impl, t.config.tun);
    if(tunfd == -1)
    {
      printf("failed to open %s\n", t.config.tun.ifname);
      return 1;
    }
    t.tun.ev.ptr = &tun_handler;
    tunif_init(&t.tun, tunfd);
    api->add(t.impl,  &t.tun.ev);
  }
  else
    printf("tun interface disabled\n");
  while(t.running)
  {
    printf("generate new identity\n");
    i2p_keygen(&t.privkey);
    i2p_privkey_dest(&t.privkey, &t.ourdest);
    char * buf = (char *) t.buf;
    i2p_dest_tob32addr(&t.ourdest, buf, sizeof(t.buf));
    printf("we are %s\n", buf);
    if(t.config.i2cp.enabled)
    {
      printf("connecting to i2p router at %s port %d\n", t.config.i2cp.addr, t.config.i2cp.port);
      if(blocking_tcp_connect(t.config.i2cp.addr, t.config.i2cp.port, &t.i2cp_fd))
      {
        t.i2cp_ev.fd = t.i2cp_fd;
        t.i2cp_ev.ptr = &i2cp_handler;
        t.i2cp_ev.flags = EV_READ;
        assert(api->add(t.impl, &t.i2cp_ev));
        i2cp_begin(&t.i2cp);
        mainloop(&t);
        api->del(t.impl, t.i2cp_fd);
      }
      else
      {
        perror("blocking_tcp_connect()");
        sleep(1);
      }
    }
    else
      mainloop(&t);
  }
  api->close(t.impl);
  i2p_crypto_end();
}